

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined8 uVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue val_00;
  JSValue JVar2;
  int iVar3;
  JSValueUnion in_RDI;
  long in_R8;
  JSValue JVar4;
  JSString *p;
  int end;
  int start;
  int len;
  JSValue ret;
  JSValue str;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  JSValueUnion JVar5;
  undefined1 in_stack_ffffffffffffff70 [16];
  JSValueUnion ctx_00;
  JSValueUnion JVar6;
  int in_stack_ffffffffffffffa0;
  undefined4 local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar4.tag = in_stack_ffffffffffffff60;
  JVar4.u.ptr = in_stack_ffffffffffffff58.ptr;
  JVar4 = JS_ToStringCheckObject(in_stack_ffffffffffffff50,JVar4);
  JVar5 = JVar4.u;
  local_8 = (JSValueUnion)JVar4.tag;
  ctx_00 = JVar5;
  JVar6 = local_8;
  iVar3 = JS_IsException(JVar4);
  if (iVar3 == 0) {
    uVar1 = *(undefined8 *)((long)JVar5.ptr + 4);
    val.tag = (int64_t)JVar5.ptr;
    val.u.ptr = JVar6.ptr;
    iVar3 = JS_ToInt32Clamp((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff70._8_8_,val,
                            in_stack_ffffffffffffff70._4_4_,in_stack_ffffffffffffff70._0_4_,
                            in_stack_ffffffffffffffa0);
    if (iVar3 == 0) {
      iVar3 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10));
      if ((iVar3 == 0) &&
         (val_00.tag = (int64_t)JVar5.ptr, val_00.u.ptr = JVar6.ptr,
         iVar3 = JS_ToInt32Clamp((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff70._8_8_,val_00,
                                 in_stack_ffffffffffffff70._4_4_,in_stack_ffffffffffffff70._0_4_,
                                 in_stack_ffffffffffffffa0), iVar3 != 0)) {
        v_00.tag = in_stack_ffffffffffffff60;
        v_00.u.ptr = in_stack_ffffffffffffff58.ptr;
        JS_FreeValue(in_stack_ffffffffffffff50,v_00);
        local_10 = 0;
        local_8.float64 = 2.96439387504748e-323;
      }
      else {
        max_int((uint)uVar1 & 0x7fffffff,in_stack_ffffffffffffffa0);
        JVar4 = js_sub_string((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff70._8_8_,
                              in_stack_ffffffffffffff70._4_4_,in_stack_ffffffffffffff70._0_4_);
        local_8 = (JSValueUnion)JVar4.tag;
        v_01.tag = (int64_t)JVar5.ptr;
        v_01.u.float64 = in_RDI.float64;
        JS_FreeValue(in_stack_ffffffffffffff50,v_01);
        local_10 = JVar4.u._0_4_;
        uStack_c = JVar4.u._4_4_;
      }
    }
    else {
      v.tag = in_stack_ffffffffffffff60;
      v.u.ptr = in_stack_ffffffffffffff58.ptr;
      JS_FreeValue(in_stack_ffffffffffffff50,v);
      local_10 = 0;
      local_8.float64 = 2.96439387504748e-323;
    }
  }
  else {
    local_10 = JVar4.u._0_4_;
    uStack_c = JVar4.u._4_4_;
  }
  JVar2.u._4_4_ = uStack_c;
  JVar2.u.int32 = local_10;
  JVar2.tag = (int64_t)local_8.ptr;
  return JVar2;
}

Assistant:

static JSValue js_string_slice(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int len, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    end = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &end, argv[1], 0, len, len)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, start, max_int(end, start));
    JS_FreeValue(ctx, str);
    return ret;
}